

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O1

void draw_label(yolo_image *im,int row,int col,yolo_image *label,float *rgb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pfVar6;
  pointer pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int local_54;
  
  iVar1 = label->h;
  iVar10 = row - iVar1;
  if (row - iVar1 < 0) {
    iVar10 = row;
  }
  if (0 < iVar1) {
    iVar2 = label->w;
    iVar3 = im->w;
    iVar4 = im->h;
    iVar13 = col;
    if (col < iVar3) {
      iVar13 = iVar3;
    }
    iVar8 = iVar4;
    if (iVar4 < iVar10) {
      iVar8 = iVar10;
    }
    local_54 = iVar10 * iVar3 + col;
    iVar9 = 0;
    iVar18 = 0;
    do {
      if (iVar18 == iVar8 - iVar10) {
        return;
      }
      if (0 < iVar2) {
        uVar5 = label->c;
        pfVar6 = (label->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar7 = (im->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = 0;
        iVar16 = local_54;
        iVar14 = iVar9;
        do {
          if (iVar15 == iVar13 - col) break;
          if (0 < (int)uVar5) {
            uVar12 = 0;
            iVar11 = iVar16;
            iVar17 = iVar14;
            do {
              pfVar7[iVar11] = pfVar6[iVar17] * rgb[uVar12];
              uVar12 = uVar12 + 1;
              iVar17 = iVar17 + iVar1 * iVar2;
              iVar11 = iVar11 + iVar4 * iVar3;
            } while (uVar5 != uVar12);
          }
          iVar15 = iVar15 + 1;
          iVar14 = iVar14 + 1;
          iVar16 = iVar16 + 1;
        } while (iVar15 != iVar2);
      }
      iVar18 = iVar18 + 1;
      iVar9 = iVar9 + iVar2;
      local_54 = local_54 + iVar3;
    } while (iVar18 != iVar1);
  }
  return;
}

Assistant:

void draw_label(yolo_image & im, int row, int col, const yolo_image & label, const float * rgb)
{
    int w = label.w;
    int h = label.h;
    if (row - h >= 0) {
        row = row - h;
    }
    for (int j = 0; j < h && j + row < im.h; j++) {
        for (int i = 0; i < w && i + col < im.w; i++) {
            for (int k = 0; k < label.c; k++) {
                float val = label.get_pixel(i, j, k);
                im.set_pixel(i + col, j + row, k, rgb[k] * val);
            }
        }
    }
}